

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

bool google::protobuf::util::FieldMaskUtil::FromJsonString(string_view str,FieldMask *out)

{
  bool bVar1;
  reference pbVar2;
  string *output;
  char in_R8B;
  string_view input;
  ConvertibleToStringView text;
  undefined1 local_c0 [8];
  string snakecase_path;
  string_view path;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  ConvertibleToStringView local_68;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  undefined1 local_40 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  paths;
  FieldMask *out_local;
  string_view str_local;
  
  paths.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)out;
  FieldMask::Clear(out);
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_68,str);
  text.value_._M_str = (char *)0x2c;
  text.value_._M_len = (size_t)local_68.value_._M_str;
  absl::lts_20250127::StrSplit<char>(&local_58,(lts_20250127 *)local_68.value_._M_len,text,in_R8B);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_40,&local_58);
  __end2 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_40);
  path._M_str = (char *)std::
                        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)&path._M_str), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end2);
    output = (string *)pbVar2->_M_len;
    path._M_len = (size_t)pbVar2->_M_str;
    snakecase_path.field_2._8_8_ = output;
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&snakecase_path.field_2 + 8));
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_c0);
      input._M_str = (char *)local_c0;
      input._M_len = path._M_len;
      bVar1 = CamelCaseToSnakeCase((FieldMaskUtil *)snakecase_path.field_2._8_8_,input,output);
      if (bVar1) {
        FieldMask::add_paths<std::__cxx11::string&>
                  ((FieldMask *)
                   paths.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      }
      else {
        str_local._M_str._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_c0);
      if (!bVar1) goto LAB_01b54881;
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end2);
  }
  str_local._M_str._7_1_ = 1;
LAB_01b54881:
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_40);
  return (bool)(str_local._M_str._7_1_ & 1);
}

Assistant:

bool FieldMaskUtil::FromJsonString(absl::string_view str, FieldMask* out) {
  out->Clear();
  std::vector<absl::string_view> paths = absl::StrSplit(str, ',');
  for (absl::string_view path : paths) {
    if (path.empty()) continue;
    std::string snakecase_path;
    if (!CamelCaseToSnakeCase(path, &snakecase_path)) {
      return false;
    }
    out->add_paths(snakecase_path);
  }
  return true;
}